

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::state::get_full_match_costs
          (state *this,CLZBase *lzbase,uint dict_pos,bit_cost_t *pBitcosts,uint match_dist,
          int min_len,int max_len,uint is_match_model_index)

{
  byte bVar1;
  raw_quasi_adaptive_huffman_data_model *prVar2;
  uint uVar3;
  bit_cost_t bVar4;
  long in_RCX;
  CLZBase *in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint in_stack_00000010;
  uint main_sym;
  uint match_low_sym;
  bit_cost_t len_cost;
  int match_len;
  sym_data_model *large_len_table;
  uint match_high_sym;
  uint num_extra_bits;
  uint match_extra;
  uint match_slot;
  bit_cost_t cost;
  uint in_stack_ffffffffffffff8c;
  raw_quasi_adaptive_huffman_data_model *in_stack_ffffffffffffff90;
  raw_quasi_adaptive_huffman_data_model *local_58;
  int local_4c;
  uint local_38;
  uint local_34;
  raw_quasi_adaptive_huffman_data_model *local_30;
  int local_28;
  uint local_24;
  long local_20;
  CLZBase *local_10;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = (raw_quasi_adaptive_huffman_data_model *)
             adaptive_bit_model::get_cost
                       ((adaptive_bit_model *)(in_RDI + 0x1c + (ulong)in_stack_00000010 * 2),1);
  bVar4 = adaptive_bit_model::get_cost
                    ((adaptive_bit_model *)(in_RDI + 0x61c + (ulong)*(uint *)(in_RDI + 4) * 2),0);
  local_30 = (raw_quasi_adaptive_huffman_data_model *)(bVar4 + (long)local_30);
  CLZBase::compute_lzx_position_slot(local_10,local_24,&local_34,&local_38);
  bVar1 = (local_10->super_CLZDecompBase).m_lzx_position_extra_bits[local_34];
  uVar3 = (uint)bVar1;
  if (uVar3 < 3) {
    local_30 = (raw_quasi_adaptive_huffman_data_model *)((ulong)bVar1 * 0x1000000 + (long)local_30);
  }
  else {
    if (4 < uVar3) {
      local_30 = (raw_quasi_adaptive_huffman_data_model *)
                 ((ulong)((uVar3 - 4) * 0x1000000) + (long)local_30);
    }
    bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_30 = (raw_quasi_adaptive_huffman_data_model *)(bVar4 + (long)local_30);
  }
  for (local_4c = local_28; prVar2 = local_30, local_4c <= in_stack_00000008;
      local_4c = local_4c + 1) {
    local_58 = local_30;
    if (8 < local_4c) {
      bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_58 = (raw_quasi_adaptive_huffman_data_model *)((long)&(prVar2->m_sym_freq).m_p + bVar4);
    }
    bVar4 = raw_quasi_adaptive_huffman_data_model::get_cost(local_58,in_stack_ffffffffffffff8c);
    *(bit_cost_t *)(local_20 + (long)local_4c * 8) = (long)&(local_58->m_sym_freq).m_p + bVar4;
    in_stack_ffffffffffffff90 = local_58;
  }
  return;
}

Assistant:

void lzcompressor::state::get_full_match_costs(CLZBase& lzbase, uint dict_pos, bit_cost_t *pBitcosts, uint match_dist, int min_len, int max_len, uint is_match_model_index) const
   {
      dict_pos;
      LZHAM_ASSERT(min_len >= cMinMatchLen);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(match_dist, match_slot, match_extra);
      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];

      if (num_extra_bits < 3)
         cost += (num_extra_bits << cBitCostScaleShift);
      else
      {
         if (num_extra_bits > 4)
            cost += ((num_extra_bits - 4) << cBitCostScaleShift);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      uint match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      const sym_data_model &large_len_table = m_large_len_table[m_cur_state >= CLZBase::cNumLitStates];

      for (int match_len = min_len; match_len <= max_len; match_len++)
      {
         bit_cost_t len_cost = cost;

         uint match_low_sym = 0;
         if (match_len >= 9)
         {
            match_low_sym = 7;
            len_cost += large_len_table.get_cost(match_len - 9);
         }
         else
            match_low_sym = match_len - 2;

         uint main_sym = match_low_sym | (match_high_sym << 3);

         pBitcosts[match_len] = len_cost + m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);
      }
   }